

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcalendarwidget.cpp
# Opt level: O3

int __thiscall QtPrivate::QCalendarModel::columnForFirstOfMonth(QCalendarModel *this,QDate date)

{
  int iVar1;
  int iVar2;
  long in_FS_OFFSET;
  qint64 local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_28 = date.jd;
  iVar1 = QCalendar::dayOfWeek((QDate)&this->m_calendar);
  iVar2 = 7;
  if (0xfffffff8 < iVar1 - 8U) {
    iVar1 = iVar1 - this->m_firstDay;
    iVar2 = iVar1 + 7;
    if (-1 < iVar1) {
      iVar2 = iVar1;
    }
    iVar2 = iVar2 + this->m_firstColumn + 8;
  }
  iVar1 = QDate::day(&local_28,*(undefined8 *)&this->m_calendar);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return (iVar2 + ((iVar1 / 7) * 7 - iVar1)) % 7;
  }
  __stack_chk_fail();
}

Assistant:

int QCalendarModel::columnForFirstOfMonth(QDate date) const
{
    return (columnForDayOfWeek(static_cast<Qt::DayOfWeek>(m_calendar.dayOfWeek(date)))
            - (date.day(m_calendar) % 7) + 8) % 7;
}